

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TACBuilderVisitor.cpp
# Opt level: O3

void __thiscall
hdc::TACBuilderVisitor::visit(TACBuilderVisitor *this,LiteralIntegerExpression *expression)

{
  int tmp;
  pointer pcVar1;
  string *psVar2;
  Token token;
  string local_a0;
  undefined1 local_80 [16];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [16];
  _Alloc_hider local_40;
  char local_30 [16];
  
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_70._M_p = (pointer)&local_60;
  LiteralExpression::get_token((Token *)local_50,&expression->super_LiteralExpression);
  local_80._8_4_ = local_50._8_4_;
  local_80._0_8_ = local_50._0_8_;
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_40);
  if (local_40._M_p != local_30) {
    operator_delete(local_40._M_p);
  }
  tmp = this->tempCounter;
  this->lastTemporary = tmp;
  this->tempCounter = tmp + 1;
  psVar2 = Token::getLexem_abi_cxx11_((Token *)local_80);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + psVar2->_M_string_length);
  emit(this,TAC_CONST_I32,tmp,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p);
  }
  return;
}

Assistant:

void TACBuilderVisitor::visit(LiteralIntegerExpression* expression) {
    Token token;

    token = expression->get_token();
    emit(TAC_CONST_I32, newTemporary(), token.getLexem());
}